

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.cpp
# Opt level: O0

double __thiscall ChebTools::ChebyshevExpansion::monotonic_solvex(ChebyshevExpansion *this,double y)

{
  double dVar1;
  Scalar *pSVar3;
  Index IVar4;
  invalid_argument *piVar5;
  long index;
  DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *this_00;
  EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *this_01;
  Scalar SVar6;
  Scalar SVar7;
  double dVar8;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  int local_1c0;
  double xscaled;
  Index i;
  int N;
  bool increasing;
  double ytol;
  VectorXd nodes;
  undefined1 local_80 [8];
  VectorXd ynodes;
  anon_class_72_2_9474d211 secant;
  ChebyshevExpansion *e;
  double y_local;
  ChebyshevExpansion *this_local;
  double dVar2;
  
  ChebyshevExpansion((ChebyshevExpansion *)
                     &ynodes.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                      m_storage.m_rows,this);
  get_node_function_values((ChebyshevExpansion *)local_80);
  get_nodes_n11((ChebyshevExpansion *)&ytol);
  SVar6 = Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::maxCoeff
                    ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_80);
  SVar7 = Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::minCoeff
                    ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_80);
  dVar8 = (SVar6 - SVar7) * 1e-14;
  this_00 = (DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_80;
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[](this_00,0);
  std::abs((int)this_00);
  if (dVar8 <= extraout_XMM0_Qa) {
    this_01 = (EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_80;
    IVar4 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size(this_01);
    Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
              ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_01,IVar4 + -1);
    std::abs((int)this_01);
    if (dVar8 <= extraout_XMM0_Qa_00) {
      IVar4 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                        ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_80);
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_80,
                          IVar4 + -1);
      dVar8 = *pSVar3;
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_80,0);
      dVar1 = *pSVar3;
      dVar2 = *pSVar3;
      if (dVar8 < dVar2 || dVar8 == dVar1) {
        IVar4 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                          ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_80);
        pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_80,
                            IVar4 + -1);
        if (y < *pSVar3) {
          piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::invalid_argument::invalid_argument
                    (piVar5,"Argument is outside the range of the expansion");
          __cxa_throw(piVar5,&std::invalid_argument::typeinfo,
                      std::invalid_argument::~invalid_argument);
        }
        pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_80,0
                           );
        if (*pSVar3 <= y && y != *pSVar3) {
          piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::invalid_argument::invalid_argument
                    (piVar5,"Argument is outside the range of the expansion");
          __cxa_throw(piVar5,&std::invalid_argument::typeinfo,
                      std::invalid_argument::~invalid_argument);
        }
      }
      else {
        IVar4 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                          ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_80);
        pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_80,
                            IVar4 + -1);
        if (*pSVar3 <= y && y != *pSVar3) {
          piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::invalid_argument::invalid_argument
                    (piVar5,"Argument is outside the range of the expansion");
          __cxa_throw(piVar5,&std::invalid_argument::typeinfo,
                      std::invalid_argument::~invalid_argument);
        }
        pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_80,0
                           );
        if (y < *pSVar3) {
          piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::invalid_argument::invalid_argument
                    (piVar5,"Argument is outside the range of the expansion");
          __cxa_throw(piVar5,&std::invalid_argument::typeinfo,
                      std::invalid_argument::~invalid_argument);
        }
      }
      IVar4 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                        ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_80);
      if (dVar8 < dVar2 || dVar8 == dVar1) {
        local_1c0 = get_decreasingleftofval<Eigen::Matrix<double,_1,1,0,_1,1>>
                              ((Matrix<double,__1,_1,_0,__1,_1> *)local_80,y,(int)IVar4);
      }
      else {
        local_1c0 = get_increasingleftofval<Eigen::Matrix<double,_1,1,0,_1,1>>
                              ((Matrix<double,__1,_1,_0,__1,_1> *)local_80,y,(int)IVar4);
      }
      index = (long)local_1c0;
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&ytol,index)
      ;
      dVar8 = *pSVar3;
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_80,
                          index);
      dVar1 = *pSVar3;
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&ytol,
                          index + 1);
      dVar2 = *pSVar3;
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_80,
                          index + 1);
      dVar8 = monotonic_solvex::anon_class_72_2_9474d211::operator()
                        ((anon_class_72_2_9474d211 *)
                         &ynodes.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                          m_storage.m_rows,dVar8,dVar1 - y,dVar2,*pSVar3 - y,1e-14,1e-14);
      this_local = (ChebyshevExpansion *)unscale_x(this,dVar8);
    }
    else {
      IVar4 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                        ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_80);
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&ytol,
                          IVar4 + -1);
      this_local = (ChebyshevExpansion *)unscale_x(this,*pSVar3);
    }
  }
  else {
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&ytol,0);
    this_local = (ChebyshevExpansion *)unscale_x(this,*pSVar3);
  }
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)&ytol);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_80);
  monotonic_solvex(double)::~__0
            ((monotonic_solvex_double_ *)
             &ynodes.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
            );
  return (double)this_local;
}

Assistant:

double ChebyshevExpansion::monotonic_solvex(double y) const {
        /*
        Function is known to be monotonic, so we can shortcut some of the solving steps used
        We don't use the eigenvalue method because it is too slow
        */
        auto& e = *this;
        auto secant = [e,y](double a, double ya, double b, double yb, double yeps = 1e-14, double xeps = 1e-14) {
            double c, yc;
            for (auto i = 0; i < 50; ++i) {
                c = b - yb * (b - a) / (yb - ya);
                yc = e.y_Clenshaw_xscaled(c)-y;
                if (yc * ya > 0) {
                    a = c; ya = yc;
                }
                else {
                    b = c; yb = yc;
                }
                if (std::abs(b - a) < xeps) { break; }
                if (std::abs(yc) < yeps) { break; }
            }
            return c;
        };
        // Determine if the function is monotonically increasing or decreasing
        auto ynodes = get_node_function_values();
        auto nodes = get_nodes_n11();

        // Check if the input is equal to (to within numerical precision) an endpoint
        auto ytol = 1e-14 * (ynodes.maxCoeff() - ynodes.minCoeff());
        if (std::abs(ynodes[0] - y) < ytol)
            return unscale_x(nodes[0]);
        if (std::abs(ynodes[ynodes.size()-1] - y) < ytol)
            return unscale_x(nodes[ynodes.size() - 1]);

        bool increasing = ynodes[ynodes.size() - 1] > ynodes[0]; // Nodes go from 1 to -1 (stuck with this), but increasing says whether the value at the last *index* (x=-1) is greater than that of the first index (x=1).
        if (increasing) {
            if (y > ynodes[ynodes.size() - 1]) {
                throw std::invalid_argument("Argument is outside the range of the expansion");
            }
            if (y < ynodes[0]) {
                throw std::invalid_argument("Argument is outside the range of the expansion");
            }
        }
        else {
            if (y < ynodes[ynodes.size() - 1]) {
                throw std::invalid_argument("Argument is outside the range of the expansion");
            }
            if (y > ynodes[0]) {
                throw std::invalid_argument("Argument is outside the range of the expansion");
            }
        }

        // Interval bisection to find the Chebyshev-Lobatto nodes that bound the solution by bisection
        int N = static_cast<int>(ynodes.size());
        Eigen::Index i = (increasing) ? get_increasingleftofval(ynodes, y, N) : get_decreasingleftofval(ynodes, y, N);
        auto xscaled = secant(nodes(i), ynodes(i)-y, nodes(i + 1), ynodes(i + 1)-y);
        return unscale_x(xscaled);
    }